

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  undefined4 uVar4;
  DataType dataType;
  DataType dataType_00;
  MatrixOp op;
  pointer pMVar5;
  byte bVar6;
  bool bVar7;
  int row_3;
  OperationType OVar8;
  int iVar9;
  DataType DVar10;
  TestMatrixType TVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  undefined8 *puVar16;
  long *plVar17;
  undefined4 *puVar18;
  ostream *poVar19;
  ostringstream *poVar20;
  char **ppcVar21;
  char *pcVar22;
  size_type *psVar23;
  float *pfVar24;
  Vector<float,_3> *pVVar25;
  int row;
  int attribNdx;
  int precision;
  Matrix<float,_2,_3> *pMVar26;
  Matrix<float,_2,_4> *pMVar27;
  float *pfVar28;
  undefined8 uVar29;
  ShaderMatrixCase *pSVar30;
  EVP_PKEY_CTX *pEVar31;
  ulong uVar32;
  _Alloc_hider _Var33;
  string *psVar34;
  int row_5;
  Vector<float,_3> *pVVar35;
  long lVar36;
  float *pfVar37;
  int row_6;
  EVP_PKEY_CTX *ctx_00;
  long lVar38;
  int iVar39;
  long lVar40;
  undefined4 *puVar41;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  long lVar42;
  pointer pbVar43;
  bool bVar44;
  float fVar45;
  DataType resultType;
  string operationValue0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  string inValue0;
  string inValue1;
  ostringstream s;
  string operationValue1;
  ostringstream vtx;
  ostringstream frag;
  undefined1 auStack_608 [8];
  ostringstream *local_600;
  DataType local_5f4;
  ShaderMatrixCase *local_5f0;
  Precision local_5e4;
  string local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c0;
  long local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  ulong *local_5a0;
  long local_598;
  ulong local_590 [2];
  string *local_580;
  char *local_578;
  char *local_570;
  char local_568;
  undefined7 uStack_567;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_558;
  char *local_538;
  long local_530;
  undefined4 *local_528;
  undefined4 *local_520;
  undefined4 *local_518;
  undefined4 *local_510;
  undefined4 *local_508;
  undefined4 *local_500;
  char *local_4f8;
  long local_4f0;
  char local_4e8;
  undefined7 uStack_4e7;
  char *local_4d8;
  undefined8 local_4d0;
  char local_4c8;
  undefined7 uStack_4c7;
  undefined1 local_4b8 [4];
  undefined1 auStack_4b4 [16];
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  ulong local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  ios_base local_448 [264];
  char *local_340;
  undefined8 local_338;
  char local_330;
  undefined7 uStack_32f;
  long local_320 [14];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_600 = (ostringstream *)local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    local_600 = (ostringstream *)local_320;
  }
  dataType = (this->m_in0).dataType;
  dataType_00 = (this->m_in1).dataType;
  local_4f8 = &local_4e8;
  local_4f0 = 0;
  local_4e8 = '\0';
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = '\0';
  local_5f4 = TYPE_LAST;
  local_5e4 = (this->m_in0).precision;
  local_558.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  op = this->m_op;
  OVar8 = MatrixCaseUtils::getOperationType(op);
  local_530 = 1;
  if (OVar8 < OPERATIONTYPE_LAST) {
    local_530 = *(long *)(&DAT_00ae3fa0 + (ulong)OVar8 * 8);
  }
  uVar1 = dataType_00 - TYPE_FLOAT_MAT2;
  uVar2 = dataType_00 - TYPE_DOUBLE_MAT2;
  local_578 = &local_568;
  local_570 = (char *)0x0;
  local_568 = '\0';
  local_340 = &local_330;
  local_338 = 0;
  local_330 = '\0';
  DVar10 = dataType;
  local_5f0 = this;
  switch(op) {
  case OP_MUL:
    if ((8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) ||
       (8 < uVar1 && 8 < uVar2)) goto switchD_0047b4b1_caseD_3;
    iVar12 = glu::getDataTypeMatrixNumColumns(dataType_00);
    iVar9 = glu::getDataTypeMatrixNumRows((local_5f0->m_in0).dataType);
    DVar10 = glu::getDataTypeMatrix(iVar12,iVar9);
    break;
  default:
switchD_0047b4b1_caseD_3:
    if ((OVar8 & ~OPERATIONTYPE_BINARY_FUNCTION) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR)
    goto switchD_0047b4b1_caseD_7;
    if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
      if (uVar1 < 9 || uVar2 < 9) goto switchD_0047b4b1_caseD_7;
      if (dataType_00 != TYPE_FLOAT) {
        iVar12 = glu::getDataTypeMatrixNumRows(dataType);
        goto LAB_0047b5b8;
      }
    }
    else {
      DVar10 = local_5f4;
      if ((uVar1 < 9 || uVar2 < 9) && (DVar10 = dataType_00, dataType != TYPE_FLOAT)) {
        iVar12 = glu::getDataTypeMatrixNumColumns(dataType_00);
LAB_0047b5b8:
        DVar10 = glu::getDataTypeFloatVec(iVar12);
      }
    }
    break;
  case OP_OUTER_PRODUCT:
    iVar12 = glu::getDataTypeScalarSize(dataType_00);
    iVar9 = glu::getDataTypeScalarSize((local_5f0->m_in0).dataType);
    DVar10 = glu::getDataTypeMatrix(iVar12,iVar9);
    break;
  case OP_TRANSPOSE:
    iVar12 = glu::getDataTypeMatrixNumRows(dataType);
    iVar9 = glu::getDataTypeMatrixNumColumns((local_5f0->m_in0).dataType);
    DVar10 = glu::getDataTypeMatrix(iVar12,iVar9);
    break;
  case OP_INVERSE:
switchD_0047b4b1_caseD_7:
    break;
  case OP_DETERMINANT:
    local_5f4 = TYPE_FLOAT;
    DVar10 = local_5f4;
  }
  local_5f4 = DVar10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  if ((local_5f0->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in mediump vec4 v_color;\n",0x19);
  }
  local_510 = &s_constInMat4x4;
  local_518 = &s_constInMat4x3;
  local_500 = &s_constInMat4x2;
  local_520 = &s_constInMat3x4;
  local_528 = &s_constInMat3x3;
  local_508 = &s_constInMat3x2;
  puVar41 = &DAT_00ae3c74;
  lVar40 = 0;
  local_538 = ";\n";
  do {
    pSVar30 = local_5f0;
    lVar42 = 0x134;
    if (lVar40 == 0) {
      lVar42 = 0x128;
    }
    pcVar13 = glu::getPrecisionName
                        (*(Precision *)
                          ((long)&(local_5f0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                  m_testCtx + lVar42));
    pcVar14 = glu::getDataTypeName
                        (*(DataType *)
                          ((long)&(pSVar30->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                  _vptr_TestNode + lVar42 + 4));
    poVar20 = local_600;
    local_580 = (string *)&local_4d8;
    if (lVar40 == 0) {
      local_580 = (string *)&local_4f8;
    }
    iVar12 = *(int *)((long)&(pSVar30->super_ShaderRenderCase).super_TestCase.super_TestNode.
                             _vptr_TestNode + lVar42);
    iVar39 = (int)lVar40;
    iVar9 = (int)local_600;
    if (iVar12 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"const ",6);
      if (pcVar13 == (char *)0x0) {
        std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar15 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar13,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
      if (pcVar14 == (char *)0x0) {
        std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar15 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar14,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," in",3);
      poVar19 = (ostream *)std::ostream::operator<<(poVar20,iVar39);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," = ",3);
      switch(*(undefined4 *)
              ((long)&(local_5f0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                      _vptr_TestNode + lVar42 + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  ((string *)local_4b8,(de *)&DAT_00000001,(float)(&s_constInFloat)[lVar40],
                   precision);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar20,_local_4b8,auStack_4b4._4_8_);
        if (_local_4b8 != auStack_4b4 + 0xc) {
          operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
        }
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  ((ostream *)poVar20,(Vector<float,_2> *)(s_constInVec2 + lVar40 * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  ((ostream *)poVar20,(Vector<float,_3> *)(s_constInVec3 + lVar40 * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  ((ostream *)poVar20,(Vector<float,_4> *)(s_constInVec4 + lVar40 * 0x10));
        break;
      case 5:
        lVar42 = lVar40 * 0x10;
        auStack_4b4._0_4_ = *(undefined4 *)(s_constInMat2x2 + lVar42 + 8);
        local_4b8 = (undefined1  [4])*(undefined4 *)(s_constInMat2x2 + lVar42);
        auStack_4b4._8_4_ = *(float *)(s_constInMat2x2 + lVar42 + 0xc);
        auStack_4b4._4_4_ = *(float *)(s_constInMat2x2 + lVar42 + 4);
        MatrixCaseUtils::writeMatrixConstructor<2,2>
                  ((ostream *)poVar20,(Matrix<float,_2,_2> *)local_4b8);
        break;
      case 6:
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        stack0xfffffffffffffb58 = 0;
        lVar42 = 0;
        do {
          uVar4 = puVar41[lVar42 * 2];
          *(undefined4 *)(local_4b8 + lVar42 * 4) = puVar41[lVar42 * 2 + -1];
          *(undefined4 *)(auStack_4b4 + lVar42 * 4 + 8) = uVar4;
          lVar42 = lVar42 + 1;
        } while (lVar42 != 3);
        MatrixCaseUtils::writeMatrixConstructor<2,3>
                  ((ostream *)poVar20,(Matrix<float,_3,_2> *)local_4b8);
        break;
      case 7:
        lVar42 = lVar40 * 0x20;
        auStack_4b4._0_4_ = *(undefined4 *)(s_constInMat2x4 + lVar42 + 8);
        local_4b8 = (undefined1  [4])*(undefined4 *)(s_constInMat2x4 + lVar42);
        auStack_4b4._8_4_ = *(float *)(s_constInMat2x4 + lVar42 + 0x18);
        auStack_4b4._4_4_ = *(float *)(s_constInMat2x4 + lVar42 + 0x10);
        uStack_4a4 = *(undefined4 *)(s_constInMat2x4 + lVar42 + 0xc);
        auStack_4b4._12_4_ = *(undefined4 *)(s_constInMat2x4 + lVar42 + 4);
        uStack_49c = *(undefined4 *)(s_constInMat2x4 + lVar42 + 0x1c);
        uStack_4a0 = *(undefined4 *)(s_constInMat2x4 + lVar42 + 0x14);
        MatrixCaseUtils::writeMatrixConstructor<2,4>
                  ((ostream *)poVar20,(Matrix<float,_4,_2> *)local_4b8);
        break;
      case 8:
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        stack0xfffffffffffffb58 = 0;
        lVar42 = 0;
        pMVar26 = (Matrix<float,_2,_3> *)local_4b8;
        bVar44 = true;
        do {
          bVar7 = bVar44;
          lVar36 = 0;
          do {
            (pMVar26->m_data).m_data[lVar36].m_data[0] =
                 *(float *)((long)local_508 + lVar36 * 4 + lVar42);
            lVar36 = lVar36 + 1;
          } while (lVar36 != 3);
          lVar42 = 0xc;
          pMVar26 = (Matrix<float,_2,_3> *)(local_4b8 + 4);
          bVar44 = false;
        } while (bVar7);
        MatrixCaseUtils::writeMatrixConstructor<3,2>
                  ((ostream *)poVar20,(Matrix<float,_2,_3> *)local_4b8);
        break;
      case 9:
        stack0xfffffffffffffb58 = 0;
        _uStack_4a0 = 0;
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        local_498 = local_498 & 0xffffffff00000000;
        lVar42 = 0;
        puVar18 = local_528;
        pVVar25 = (Vector<float,_3> *)local_4b8;
        do {
          lVar36 = 0;
          pVVar35 = pVVar25;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar35->m_data)->m_data[0].m_data[0] =
                 (float)puVar18[lVar36];
            lVar36 = lVar36 + 1;
            pVVar35 = pVVar35 + 1;
          } while (lVar36 != 3);
          lVar42 = lVar42 + 1;
          pVVar25 = (Vector<float,_3> *)(pVVar25->m_data + 1);
          puVar18 = puVar18 + 3;
        } while (lVar42 != 3);
        MatrixCaseUtils::writeMatrixConstructor<3,3>
                  ((ostream *)poVar20,(Matrix<float,_3,_3> *)local_4b8);
        break;
      case 10:
        local_498 = 0;
        uStack_490 = 0;
        stack0xfffffffffffffb58 = 0;
        _uStack_4a0 = 0;
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        lVar42 = 0;
        puVar18 = local_520;
        pfVar24 = (float *)local_4b8;
        do {
          lVar36 = 0;
          do {
            pfVar24[lVar36] = *(float *)((long)puVar18 + lVar36);
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0xc);
          lVar42 = lVar42 + 1;
          pfVar24 = pfVar24 + 1;
          puVar18 = puVar18 + 3;
        } while (lVar42 != 4);
        MatrixCaseUtils::writeMatrixConstructor<3,4>
                  ((ostream *)poVar20,(Matrix<float,_4,_3> *)local_4b8);
        break;
      case 0xb:
        stack0xfffffffffffffb58 = 0;
        _uStack_4a0 = 0;
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        lVar42 = 0;
        pMVar27 = (Matrix<float,_2,_4> *)local_4b8;
        bVar44 = true;
        do {
          bVar7 = bVar44;
          lVar36 = 0;
          do {
            (pMVar27->m_data).m_data[lVar36].m_data[0] =
                 *(float *)((long)local_500 + lVar36 * 4 + lVar42);
            lVar36 = lVar36 + 1;
          } while (lVar36 != 4);
          lVar42 = 0x10;
          pMVar27 = (Matrix<float,_2,_4> *)(local_4b8 + 4);
          bVar44 = false;
        } while (bVar7);
        MatrixCaseUtils::writeMatrixConstructor<4,2>
                  ((ostream *)poVar20,(Matrix<float,_2,_4> *)local_4b8);
        break;
      case 0xc:
        local_498 = 0;
        uStack_490 = 0;
        stack0xfffffffffffffb58 = 0;
        _uStack_4a0 = 0;
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        lVar42 = 0;
        puVar18 = local_518;
        pVVar25 = (Vector<float,_3> *)local_4b8;
        do {
          lVar36 = 0;
          pVVar35 = pVVar25;
          do {
            ((Vector<tcu::Vector<float,_3>,_4> *)pVVar35->m_data)->m_data[0].m_data[0] =
                 (float)puVar18[lVar36];
            lVar36 = lVar36 + 1;
            pVVar35 = pVVar35 + 1;
          } while (lVar36 != 4);
          lVar42 = lVar42 + 1;
          pVVar25 = (Vector<float,_3> *)(pVVar25->m_data + 1);
          puVar18 = puVar18 + 4;
        } while (lVar42 != 3);
        MatrixCaseUtils::writeMatrixConstructor<4,3>
                  ((ostream *)poVar20,(Matrix<float,_3,_4> *)local_4b8);
        break;
      case 0xd:
        local_488 = 0;
        uStack_480 = 0;
        local_498 = 0;
        uStack_490 = 0;
        stack0xfffffffffffffb58 = 0;
        _uStack_4a0 = 0;
        _local_4b8 = (char *)0x0;
        auStack_4b4._4_4_ = 0.0;
        auStack_4b4._8_4_ = 0.0;
        lVar42 = 0;
        puVar18 = local_510;
        pfVar24 = (float *)local_4b8;
        do {
          lVar36 = 0;
          do {
            pfVar24[lVar36] = *(float *)((long)puVar18 + lVar36);
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x10);
          lVar42 = lVar42 + 1;
          pfVar24 = pfVar24 + 1;
          puVar18 = puVar18 + 4;
        } while (lVar42 != 4);
        MatrixCaseUtils::writeMatrixConstructor<4,4>
                  ((ostream *)poVar20,(Matrix<float,_4,_4> *)local_4b8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,";\n",2);
      local_5c0 = &local_5b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"in","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
      std::ostream::operator<<((ostringstream *)local_4b8,iVar39);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
      std::ios_base::~ios_base(local_448);
      uVar29 = 0xf;
      if (local_5c0 != &local_5b0) {
        uVar29 = local_5b0._M_allocated_capacity;
      }
      if ((ulong)uVar29 < (ulong)(local_598 + local_5b8)) {
        uVar32 = 0xf;
        if (local_5a0 != local_590) {
          uVar32 = local_590[0];
        }
        if ((ulong)(local_598 + local_5b8) <= uVar32) {
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_5a0,0,(char *)0x0,(ulong)local_5c0);
          goto LAB_0047c6af;
        }
      }
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_5a0);
LAB_0047c6af:
      local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
      puVar3 = puVar16 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3) {
        local_5e0.field_2._M_allocated_capacity = *puVar3;
        local_5e0.field_2._8_8_ = puVar16[3];
      }
      else {
        local_5e0.field_2._M_allocated_capacity = *puVar3;
        local_5e0._M_dataplus._M_p = (pointer)*puVar16;
      }
      local_5e0._M_string_length = puVar16[1];
      *puVar16 = puVar3;
      puVar16[1] = 0;
      *(undefined1 *)puVar3 = 0;
      std::__cxx11::string::operator=(local_580,(string *)&local_5e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
      }
      if (local_5a0 != local_590) {
        operator_delete(local_5a0,local_590[0] + 1);
      }
      uVar29 = local_5b0._M_allocated_capacity;
      _Var33._M_p = (pointer)local_5c0;
      if (local_5c0 != &local_5b0) {
LAB_0047c755:
        operator_delete(_Var33._M_p,uVar29 + 1);
      }
    }
    else {
      if (iVar12 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"uniform ",8);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
        }
        else {
          sVar15 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar13,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear(iVar9 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
        }
        else {
          sVar15 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar14,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," u_in",5);
        poVar19 = (ostream *)std::ostream::operator<<(poVar20,iVar39);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
        local_5c0 = &local_5b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"u_in","");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
        std::ostream::operator<<((ostringstream *)local_4b8,iVar39);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
        std::ios_base::~ios_base(local_448);
        uVar29 = 0xf;
        if (local_5c0 != &local_5b0) {
          uVar29 = local_5b0._M_allocated_capacity;
        }
        if ((ulong)uVar29 < (ulong)(local_598 + local_5b8)) {
          uVar32 = 0xf;
          if (local_5a0 != local_590) {
            uVar32 = local_590[0];
          }
          if ((ulong)(local_598 + local_5b8) <= uVar32) {
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_5a0,0,(char *)0x0,(ulong)local_5c0);
            goto LAB_0047c6af;
          }
        }
        puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_5a0)
        ;
        goto LAB_0047c6af;
      }
      if (iVar12 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"in ",3);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
        }
        else {
          sVar15 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
        }
        else {
          sVar15 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," a_",3);
        iVar12 = *(int *)((long)&(local_5f0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                                 _vptr_TestNode + lVar42 + 4);
        if (8 < iVar12 - 5U && 8 < iVar12 - 0x12U) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"coords;\n",8);
          pcVar22 = "a_coords";
          if ((local_5f0->super_ShaderRenderCase).m_isVertexCase == false) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8)
              ;
            }
            else {
              sVar15 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,pcVar13,sVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8)
              ;
            }
            else {
              sVar15 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,pcVar14,sVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320," v_coords;\n",0xb);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
            if (pcVar13 == (char *)0x0) {
              std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x460)
              ;
            }
            else {
              sVar15 = strlen(pcVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar13,sVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
            if (pcVar14 == (char *)0x0) {
              std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x460)
              ;
            }
            else {
              sVar15 = strlen(pcVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar14,sVar15);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," v_coords;\n",0xb);
            _local_4b8 = auStack_4b4 + 0xc;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"coords","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_558,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4b8);
            if (_local_4b8 != auStack_4b4 + 0xc) {
              operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
            }
            pcVar22 = "v_coords";
            if (((local_5f0->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
              pcVar22 = "a_coords";
            }
          }
          ppcVar21 = &local_4d8;
          if (lVar40 == 0) {
            ppcVar21 = &local_4f8;
          }
          std::__cxx11::string::_M_replace((ulong)local_580,0,ppcVar21[1],(ulong)pcVar22);
          goto LAB_0047c75d;
        }
        if (pcVar14 == (char *)0x0) {
          std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
        }
        else {
          sVar15 = strlen(pcVar14);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
        bVar6 = 1;
        if ((local_5f0->super_ShaderRenderCase).m_isVertexCase == false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"out ",4);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
          }
          else {
            sVar15 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
          }
          else {
            sVar15 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," v_",3);
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x2e8);
          }
          else {
            sVar15 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar14,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,";\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x460);
          }
          else {
            sVar15 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar13,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x460);
          }
          else {
            sVar15 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," v_",3);
          if (pcVar14 == (char *)0x0) {
            std::ios::clear((int)auStack_608 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x460);
          }
          else {
            sVar15 = strlen(pcVar14);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar14,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4b8,pcVar14,(allocator<char> *)&local_5e0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_558
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8
                    );
          if (_local_4b8 != auStack_4b4 + 0xc) {
            operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
          }
          bVar6 = (local_5f0->super_ShaderRenderCase).m_isVertexCase;
        }
        bVar44 = (bVar6 & 1) != 0;
        pcVar13 = "v_";
        if (bVar44) {
          pcVar13 = "a_";
        }
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        pcVar14 = "";
        if (bVar44) {
          pcVar14 = "";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,pcVar13,pcVar14);
        glu::getDataTypeName
                  (*(DataType *)
                    ((long)&(local_5f0->super_ShaderRenderCase).super_TestCase.super_TestNode.
                            _vptr_TestNode + lVar42 + 4));
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_5e0);
        psVar23 = (size_type *)(plVar17 + 2);
        if ((size_type *)*plVar17 == psVar23) {
          unique0x10001e1d = *psVar23;
          _uStack_4a0 = plVar17[3];
          _local_4b8 = auStack_4b4 + 0xc;
        }
        else {
          unique0x00012000 = *psVar23;
          _local_4b8 = (pointer)*plVar17;
        }
        auStack_4b4._4_8_ = *(float (*) [2])(plVar17 + 1);
        *plVar17 = (long)psVar23;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::__cxx11::string::operator=(local_580,(string *)local_4b8);
        if (_local_4b8 != auStack_4b4 + 0xc) {
          operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
        }
        uVar29 = local_5e0.field_2._M_allocated_capacity;
        _Var33._M_p = local_5e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p == &local_5e0.field_2) goto LAB_0047c75d;
        goto LAB_0047c755;
      }
    }
LAB_0047c75d:
    lVar40 = lVar40 + 1;
    local_510 = local_510 + 0x10;
    local_518 = local_518 + 0xc;
    local_500 = local_500 + 8;
    local_520 = local_520 + 0xc;
    local_528 = local_528 + 9;
    local_508 = local_508 + 6;
    puVar41 = puVar41 + 6;
  } while (lVar40 != local_530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  if ((local_5f0->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\tdEQP_FragColor = v_color;\n",0x1b);
  }
  else if (local_558.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_558.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar43 = local_558.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_",3);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_320,(pbVar43->_M_dataplus)._M_p,
                           pbVar43->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"a_",2);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(pbVar43->_M_dataplus)._M_p,pbVar43->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
      pbVar43 = pbVar43 + 1;
    } while (pbVar43 !=
             local_558.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_5f0->m_op - OP_PRE_INCREMENT < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," tmpValue = ",0xc);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,local_4f8,local_4f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
    std::__cxx11::string::_M_replace((ulong)&local_578,0,local_570,0xae40f4);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_578);
  }
  psVar34 = (string *)&local_340;
  std::__cxx11::string::_M_assign(psVar34);
  OVar8 = MatrixCaseUtils::getOperationType(local_5f0->m_op);
  switch(OVar8) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    poVar20 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,local_578,(long)local_570);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,pcVar13,sVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20," ",1);
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"(",1);
    poVar20 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,local_578,(long)local_570);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar20,", ",2);
    ppcVar21 = &local_340;
    goto LAB_0047d187;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    psVar34 = (string *)&local_578;
    poVar20 = local_600;
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,local_578,(long)local_570);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    lVar40 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar13,sVar15);
    goto LAB_0047d285;
  case OPERATIONTYPE_UNARY_FUNCTION:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"(",1);
    ppcVar21 = &local_578;
    poVar20 = local_600;
LAB_0047d187:
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar20,*ppcVar21,(long)ppcVar21[1]);
    lVar40 = 3;
    local_538 = ");\n";
    goto LAB_0047d285;
  case OPERATIONTYPE_ASSIGNMENT:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
    pcVar13 = glu::getPrecisionName(local_5e4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    pcVar13 = glu::getDataTypeName(local_5f4);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)local_600 + (int)*(undefined8 *)(*(long *)local_600 + -0x18));
    }
    else {
      sVar15 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," res = ",7);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,local_578,(long)local_570);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\tres ",5);
    pcVar13 = MatrixCaseUtils::getOperationName(local_5f0->m_op);
    sVar15 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,sVar15);
    poVar20 = local_600;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," ",1);
    break;
  default:
    goto switchD_0047cab5_default;
  }
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar20,*(char **)psVar34,*(long *)(psVar34 + 8));
  lVar40 = 2;
LAB_0047d285:
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_538,lVar40);
switchD_0047cab5_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"\t",1);
  pcVar13 = "dEQP_FragColor";
  bVar44 = (local_5f0->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar44) {
    pcVar13 = "v_color";
  }
  lVar40 = 0xe;
  if (bVar44) {
    lVar40 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,pcVar13,lVar40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600," = ",3);
  if (local_5f0->m_op - OP_PRE_INCREMENT < 4) {
    pSVar30 = (ShaderMatrixCase *)0xae4123;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)local_4b8,pSVar30,&local_5f4,"res");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,_local_4b8,auStack_4b4._4_8_);
    pcVar13 = ", 1.0) + vec4(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 1.0) + vec4(",0xe);
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_5e0,(ShaderMatrixCase *)pcVar13,&local_5f4,"tmpValue");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar19,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 0.0);\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pSVar30 = (ShaderMatrixCase *)0xae4123;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_600,"vec4(",5);
    genGLSLMatToVec3Reduction_abi_cxx11_((string *)local_4b8,pSVar30,&local_5f4,"res");
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_600,_local_4b8,auStack_4b4._4_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", 1.0);\n",8);
  }
  if (_local_4b8 != auStack_4b4 + 0xc) {
    operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  pSVar30 = local_5f0;
  std::__cxx11::string::operator=
            ((string *)&(local_5f0->super_ShaderRenderCase).m_vertShaderSource,(string *)local_4b8);
  if (_local_4b8 != auStack_4b4 + 0xc) {
    operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(pSVar30->super_ShaderRenderCase).m_fragShaderSource,(string *)local_4b8);
  if (_local_4b8 != auStack_4b4 + 0xc) {
    operator_delete(_local_4b8,stack0xfffffffffffffb58 + 1);
  }
  this_00 = &(pSVar30->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  pfVar24 = (float *)(this_00->
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
  pfVar28 = pfVar24;
  pEVar31 = (EVP_PKEY_CTX *)0x0;
  do {
    local_488 = 0;
    uStack_480 = 0;
    local_498 = 0;
    uStack_490 = 0;
    stack0xfffffffffffffb58 = 0;
    _uStack_4a0 = 0;
    _local_4b8 = (pointer)0x0;
    auStack_4b4._4_4_ = 0.0;
    auStack_4b4._8_4_ = 0.0;
    lVar40 = 0;
    psVar34 = (string *)local_4b8;
    do {
      lVar42 = 0;
      do {
        *(undefined4 *)(psVar34 + lVar42) = 0;
        lVar42 = lVar42 + 0x10;
      } while (lVar42 != 0x40);
      lVar40 = lVar40 + 1;
      psVar34 = psVar34 + 4;
    } while (lVar40 != 4);
    lVar40 = 0;
    psVar34 = (string *)local_4b8;
    pfVar37 = pfVar28;
    do {
      lVar42 = 0;
      do {
        *(undefined4 *)((long)pfVar37 + lVar42) = *(undefined4 *)(psVar34 + lVar42);
        lVar42 = lVar42 + 0x10;
      } while (lVar42 != 0x40);
      lVar40 = lVar40 + 1;
      pfVar37 = pfVar37 + 1;
      psVar34 = psVar34 + 4;
    } while (lVar40 != 4);
    (pfVar24 + (long)pEVar31 * 0x10 + 0xc)[0] = 0.2;
    (pfVar24 + (long)pEVar31 * 0x10 + 0xc)[1] = 0.1;
    pfVar24[(long)pEVar31 * 0x10 + 0xe] = (float)(int)pEVar31 * 0.15 + 0.4;
    pfVar24[(long)pEVar31 * 0x10 + 0xf] = 0.7;
    pfVar24[(long)pEVar31 * 0x11] = 1.0;
    ctx_00 = pEVar31 + 1;
    pfVar24[(long)pEVar31 * 0x10 + (ulong)((uint)ctx_00 & 3) + 4] = 1.0;
    pfVar24[(long)pEVar31 * 0x10 + ((ulong)pEVar31 & 0xffffffff ^ 2) + 8] = 1.0;
    pfVar24[(long)pEVar31 * 0x10 + (ulong)((int)pEVar31 - 1U & 3) + 0xc] = 1.0;
    pfVar28 = pfVar28 + 0x10;
    pEVar31 = ctx_00;
  } while (ctx_00 != (EVP_PKEY_CTX *)0x4);
  TVar11 = MatrixCaseUtils::getOperationTestMatrixType(local_5f0->m_op);
  if (TVar11 != TESTMATRIXTYPE_DEFAULT) {
    lVar40 = 0;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    do {
      lVar36 = 0;
      lVar42 = lVar40;
      do {
        pMVar5 = (this_00->
                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar38 = 0;
        do {
          switch(TVar11) {
          case TESTMATRIXTYPE_NEGATED:
            fVar45 = -*(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42);
            break;
          case TESTMATRIXTYPE_INCREMENTED:
            fVar45 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42) + 0.3;
            break;
          case TESTMATRIXTYPE_DECREMENTED:
            fVar45 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42) + -0.3;
            break;
          case TESTMATRIXTYPE_NEGATED_INCREMENTED:
            fVar45 = 0.3 - *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42);
            break;
          case TESTMATRIXTYPE_INCREMENTED_LESS:
            fVar45 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42) + -0.1;
            break;
          default:
            goto switchD_0047d699_default;
          }
          *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar38 + lVar42) = fVar45;
switchD_0047d699_default:
          lVar38 = lVar38 + 0x10;
        } while (lVar38 != 0x40);
        lVar36 = lVar36 + 1;
        lVar42 = lVar42 + 4;
      } while (lVar36 != 4);
      ctx_00 = ctx_00 + 1;
      lVar40 = lVar40 + 0x40;
    } while (ctx_00 != (EVP_PKEY_CTX *)0x4);
  }
  deqp::gls::ShaderRenderCase::init(&local_5f0->super_ShaderRenderCase,ctx_00);
  if (local_340 != &local_330) {
    operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_558);
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  iVar12 = std::ios_base::~ios_base(local_2b0);
  return iVar12;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	vtx << "in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "in " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_coords;\n";
					frag << "in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx](                  0, 3) = 0.2f;								// !< prevent matrix*vec from going into zero (assuming vec.w != 0)
		m_userAttribTransforms[attribNdx](                  1, 3) = 0.1f;								// !<
		m_userAttribTransforms[attribNdx](                  2, 3) = 0.4f + 0.15f * float(attribNdx);	// !<
		m_userAttribTransforms[attribNdx](                  3, 3) = 0.7f;								// !<
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.3f;
						break;
					case TESTMATRIXTYPE_NEGATED_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col) + 0.3f;
						break;
					case TESTMATRIXTYPE_INCREMENTED_LESS:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}